

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<data_structures::SymbolTableElement<int,_int>_> * __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::insertAfterNode
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this,
          ListNode<data_structures::SymbolTableElement<int,_int>_> *_current,
          SymbolTableElement<int,_int> *new_element)

{
  int iVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar2;
  
  pLVar2 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar2->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010bbd8;
  (pLVar2->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010bc08;
  iVar1 = new_element->value;
  (pLVar2->element).key = new_element->key;
  (pLVar2->element).value = iVar1;
  pLVar2->_next = _current->_next;
  _current->_next = pLVar2;
  this->_size = this->_size + 1;
  if (this->_tail == _current) {
    this->_tail = pLVar2;
  }
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::insertAfterNode(ListNode<T>* _current, const T &new_element){
        _current->insertAfter(new ListNode<T>(new_element));
        _size++;
        if (_current == _tail) {
            _tail = _current->next();
        }
        return this;
    }